

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpscValueQueue.h
# Opt level: O0

ssize_t __thiscall
teetime::SpscValueQueue<teetime::File>::write
          (SpscValueQueue<teetime::File> *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  type this_00;
  undefined7 extraout_var;
  File *p;
  undefined4 in_register_00000034;
  size_t local_50;
  size_t next;
  Entry *entry;
  size_t index;
  File *t_local;
  SpscValueQueue<teetime::File> *this_local;
  SpscValueQueue<teetime::File> *pSVar2;
  
  local_50 = this->m_writeIndex;
  this_00 = std::
            unique_ptr<teetime::SpscValueQueue<teetime::File>::Entry[],_std::default_delete<teetime::SpscValueQueue<teetime::File>::Entry[]>_>
            ::operator[](&this->m_array,local_50);
  bVar1 = std::atomic<bool>::load(&this_00->hasValue,memory_order_acquire);
  pSVar2 = (SpscValueQueue<teetime::File> *)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    p = Entry::ptr(this_00);
    internal::constructAt<teetime::File>((File *)CONCAT44(in_register_00000034,__fd),p);
    std::atomic<bool>::store(&this_00->hasValue,true,memory_order_release);
    local_50 = local_50 + 1;
    if (local_50 == this->m_capacity) {
      local_50 = 0;
    }
    this->m_writeIndex = local_50;
    this_local._7_1_ = 1;
    pSVar2 = this;
  }
  return CONCAT71((int7)((ulong)pSVar2 >> 8),this_local._7_1_);
}

Assistant:

bool write(T&& t)
  {
    const auto index = m_writeIndex;
    auto& entry = m_array[index];

    if (!entry.hasValue.load(std::memory_order_acquire))
    {
      internal::constructAt<T>(std::move(t), entry.ptr());
      entry.hasValue.store(true, std::memory_order_release);
      const auto next = index + 1;
      m_writeIndex = (next != m_capacity) ? next : 0;
      return true;
    }

    return false;
  }